

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_write.cpp
# Opt level: O0

bool check_string(string *stra)

{
  ulong uVar1;
  char *pcVar2;
  int local_1c;
  int i;
  string *stra_local;
  
  local_1c = 0;
  while( true ) {
    uVar1 = std::__cxx11::string::length();
    if (uVar1 <= (ulong)(long)local_1c) {
      return false;
    }
    pcVar2 = (char *)std::__cxx11::string::at((ulong)stra);
    if (*pcVar2 != ' ') break;
    local_1c = local_1c + 1;
  }
  return true;
}

Assistant:

bool check_string(string stra)
{
	for (int i = 0; i < stra.length(); i++)
	{
		if (stra.at(i) != ' ')
		{
			return true;
		}
	}
	return false;
}